

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
* xmotion::utils::
  ReconstructPath<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator>
            (vertex_iterator start_vtx,vertex_iterator goal_vtx)

{
  bool bVar1;
  Vertex *pVVar2;
  iterator __first;
  iterator __last;
  __node_type *in_RDX;
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  *in_RDI;
  vertex_iterator waypoint;
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  *path;
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  *this;
  value_type *in_stack_ffffffffffffffb8;
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  *in_stack_ffffffffffffffc0;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  local_28;
  undefined1 local_19;
  __node_type *local_18;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  local_10 [2];
  
  local_19 = 0;
  this = in_RDI;
  local_18 = in_RDX;
  std::
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  ::vector((vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
            *)0x102109);
  local_28._M_cur = local_18;
  while (bVar1 = std::__detail::operator!=(&local_28,local_10), bVar1) {
    std::
    vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
    ::push_back(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    pVVar2 = Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator::operator->
                       ((vertex_iterator *)0x102142);
    local_28._M_cur =
         (pVVar2->search_parent).super_const_vertex_iterator.super_VertexMapTypeIterator.
         super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
         ._M_cur;
  }
  std::
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  ::push_back(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  __first = std::
            vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
            ::begin(this);
  __last = std::
           vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
           ::end(this);
  std::
  reverse<__gnu_cxx::__normal_iterator<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator*,std::vector<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator,std::allocator<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator>>>>
            ((__normal_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator_*,_std::vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>_>
              )__first._M_current,
             (__normal_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator_*,_std::vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>_>
              )__last._M_current);
  return in_RDI;
}

Assistant:

static std::vector<VertexIterator> ReconstructPath(VertexIterator start_vtx,
                                                   VertexIterator goal_vtx) {
  std::vector<VertexIterator> path;
  VertexIterator waypoint = goal_vtx;
  while (waypoint != start_vtx) {
    path.push_back(waypoint);
    waypoint = waypoint->search_parent;
  }
  // add the start node
  path.push_back(waypoint);
  std::reverse(path.begin(), path.end());
#ifndef MINIMAL_PRINTOUT
  auto traj_s = path.begin();
  auto traj_e = path.end() - 1;
  std::cout << "starting vertex id: " << (*traj_s)->vertex_id_ << std::endl;
  std::cout << "finishing vertex id: " << (*traj_e)->vertex_id_ << std::endl;
  std::cout << "path length: " << path.size() << std::endl;
  std::cout << "total cost: " << path.back()->g_cost << std::endl;
#endif
  return path;
}